

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

int gdImageConvolution(gdImagePtr src,float (*filter) [3],float filter_div,float offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int color;
  gdImagePtr im;
  code *pcVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float (*pafVar11) [3];
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint local_80;
  long local_70;
  
  iVar1 = 0;
  if (src != (gdImagePtr)0x0) {
    im = gdImageCreateTrueColor(src->sx,src->sy);
    if (im != (gdImagePtr)0x0) {
      gdImageSaveAlpha(im,1);
      iVar1 = gdImageColorAllocateAlpha(im,0,0,0,0x7f);
      gdImageFill(im,0,0,iVar1);
      gdImageCopy(im,src,0,0,0,0,src->sx,src->sy);
      if (src->trueColor == 0) {
        pcVar5 = gdImageGetPixel;
      }
      else {
        pcVar5 = gdImageGetTrueColorPixel;
      }
      iVar1 = src->sy;
      if (0 < iVar1) {
        uVar6 = (ulong)(uint)src->sx;
        local_70 = 0;
        uVar3 = 0;
        do {
          if (0 < (int)uVar6) {
            iVar1 = -1;
            lVar12 = 0;
            do {
              if (im->trueColor == 0) {
                local_80 = im->alpha[(int)uVar3];
              }
              else {
                local_80 = uVar3 >> 0x18 & 0x7f;
              }
              fVar16 = 0.0;
              lVar7 = 0;
              fVar17 = 0.0;
              fVar18 = 0.0;
              pafVar11 = filter;
              do {
                iVar2 = (int)local_70 + -1 + (int)lVar7;
                if (iVar2 < 1) {
                  iVar2 = 0;
                }
                iVar10 = src->sy + -1;
                if (iVar2 < iVar10) {
                  iVar10 = iVar2;
                }
                lVar8 = 0;
                do {
                  iVar2 = iVar1 + (int)lVar8;
                  if (iVar2 < 1) {
                    iVar2 = 0;
                  }
                  iVar9 = src->sx + -1;
                  if (iVar2 < iVar9) {
                    iVar9 = iVar2;
                  }
                  uVar3 = (*pcVar5)(im,iVar9,iVar10);
                  if (im->trueColor == 0) {
                    fVar13 = (*pafVar11)[lVar8];
                    fVar14 = (float)im->red[(int)uVar3] * fVar13;
                    fVar15 = (float)im->green[(int)uVar3] * fVar13;
                    uVar4 = im->blue[(int)uVar3];
                  }
                  else {
                    fVar13 = (*pafVar11)[lVar8];
                    fVar14 = (float)(uVar3 >> 0x10 & 0xff) * fVar13;
                    fVar15 = (float)(uVar3 >> 8 & 0xff) * fVar13;
                    uVar4 = uVar3 & 0xff;
                  }
                  fVar18 = fVar18 + fVar14;
                  fVar17 = fVar17 + fVar15;
                  fVar16 = fVar16 + (float)(int)uVar4 * fVar13;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                lVar7 = lVar7 + 1;
                pafVar11 = pafVar11 + 1;
              } while (lVar7 != 3);
              fVar18 = fVar18 / filter_div + offset;
              iVar10 = 0xff;
              iVar2 = 0xff;
              if (fVar18 <= 255.0) {
                fVar13 = 0.0;
                if (0.0 <= fVar18) {
                  fVar13 = fVar18;
                }
                iVar2 = (int)fVar13;
              }
              fVar17 = fVar17 / filter_div + offset;
              if (fVar17 <= 255.0) {
                fVar18 = 0.0;
                if (0.0 <= fVar17) {
                  fVar18 = fVar17;
                }
                iVar10 = (int)fVar18;
              }
              fVar16 = fVar16 / filter_div + offset;
              iVar9 = 0xff;
              if (fVar16 <= 255.0) {
                fVar17 = 0.0;
                if (0.0 <= fVar16) {
                  fVar17 = fVar16;
                }
                iVar9 = (int)fVar17;
              }
              color = gdImageColorAllocateAlpha(src,iVar2,iVar10,iVar9,local_80);
              if (color == -1) {
                color = gdImageColorClosestAlpha(src,iVar2,iVar10,iVar9,local_80);
              }
              gdImageSetPixel(src,(int)lVar12,(int)local_70,color);
              lVar12 = lVar12 + 1;
              uVar6 = (ulong)src->sx;
              iVar1 = iVar1 + 1;
            } while (lVar12 < (long)uVar6);
            iVar1 = src->sy;
          }
          local_70 = local_70 + 1;
        } while (local_70 < iVar1);
      }
      gdImageDestroy(im);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageConvolution(gdImagePtr src, float filter[3][3], float filter_div, float offset)
{
	int         x, y, i, j, new_a;
	float       new_r, new_g, new_b;
	int         new_pxl, pxl=0;
	gdImagePtr  srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}

	gdImageSaveAlpha(srcback, 1);
	new_pxl = gdImageColorAllocateAlpha(srcback, 0, 0, 0, 127);
	gdImageFill(srcback, 0, 0, new_pxl);

	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for ( y=0; y<src->sy; y++) {
		for(x=0; x<src->sx; x++) {
			new_r = new_g = new_b = 0;
			new_a = gdImageAlpha(srcback, pxl);

			for (j=0; j<3; j++) {
				int yv = MIN(MAX(y - 1 + j, 0), src->sy - 1);
				for (i=0; i<3; i++) {
				        pxl = f(srcback, MIN(MAX(x - 1 + i, 0), src->sx - 1), yv);
					new_r += (float)gdImageRed(srcback, pxl) * filter[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * filter[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * filter[j][i];
				}
			}

			new_r = (new_r/filter_div)+offset;
			new_g = (new_g/filter_div)+offset;
			new_b = (new_b/filter_div)+offset;

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);

			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}